

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int handleAlias(poptContext con,char *longName,size_t longNameLen,char shortName,char *nextArg)

{
  int iVar1;
  poptItem ppVar2;
  int local_58;
  int local_54;
  char **ppcStack_50;
  int ac;
  char **av;
  int i;
  int rc;
  poptItem item;
  char *nextArg_local;
  char shortName_local;
  size_t longNameLen_local;
  char *longName_local;
  poptContext con_local;
  
  ppVar2 = con->os->currAlias;
  if (ppVar2 != (poptItem)0x0) {
    if (((longName != (char *)0x0) && ((ppVar2->option).longName != (char *)0x0)) &&
       (iVar1 = longOptionStrcmp(&ppVar2->option,longName,longNameLen), iVar1 != 0)) {
      return 0;
    }
    if ((shortName != '\0') && (shortName == (ppVar2->option).shortName)) {
      return 0;
    }
  }
  if ((con->aliases == (poptItem)0x0) || (con->numAliases < 1)) {
    con_local._4_4_ = 0;
  }
  else {
    av._0_4_ = con->numAliases;
    do {
      while( true ) {
        av._0_4_ = (int)av + -1;
        if ((int)av < 0) goto LAB_00104fe8;
        ppVar2 = con->aliases + (int)av;
        if (longName == (char *)0x0) break;
        if (((ppVar2->option).longName != (char *)0x0) &&
           (iVar1 = longOptionStrcmp(&ppVar2->option,longName,longNameLen), iVar1 != 0))
        goto LAB_00104fe8;
      }
    } while (shortName != (ppVar2->option).shortName);
LAB_00104fe8:
    if ((int)av < 0) {
      con_local._4_4_ = 0;
    }
    else if ((long)con->os - (long)con >> 6 == 9) {
      con_local._4_4_ = -0xd;
    }
    else {
      if (((longName == (char *)0x0) && (nextArg != (char *)0x0)) && (*nextArg != '\0')) {
        con->os->nextCharArg = nextArg;
      }
      con->os = con->os + 1;
      con->os->next = 0;
      con->os->stuffed = 0;
      con->os->nextArg = (char *)0x0;
      con->os->nextCharArg = (char *)0x0;
      con->os->currAlias = con->aliases + (int)av;
      local_54 = con->os->currAlias->argc;
      if (((longName == (char *)0x0) || (nextArg == (char *)0x0)) || (*nextArg == '\0')) {
        ppcStack_50 = con->os->currAlias->argv;
      }
      else {
        ppcStack_50 = (char **)malloc((long)(local_54 + 2) << 3);
        if (ppcStack_50 == (char **)0x0) {
          ppcStack_50 = con->os->currAlias->argv;
        }
        else {
          for (av._0_4_ = 0; (int)av < local_54; av._0_4_ = (int)av + 1) {
            ppcStack_50[(int)av] = con->os->currAlias->argv[(int)av];
          }
          ppcStack_50[local_54] = nextArg;
          ppcStack_50[local_54 + 1] = (char *)0x0;
          local_54 = local_54 + 1;
        }
      }
      local_58 = poptDupArgv(local_54,ppcStack_50,&con->os->argc,&con->os->argv);
      if ((ppcStack_50 != (char **)0x0) && (ppcStack_50 != con->os->currAlias->argv)) {
        free(ppcStack_50);
      }
      con->os->argb = (pbm_set *)0x0;
      if (local_58 == 0) {
        local_58 = 1;
      }
      con_local._4_4_ = local_58;
    }
  }
  return con_local._4_4_;
}

Assistant:

static int handleAlias(poptContext con,
		const char * longName, size_t longNameLen,
		char shortName,
		const char * nextArg)
{
    poptItem item = con->os->currAlias;
    int rc;
    int i;

    if (item) {
	if (longName && item->option.longName != NULL
	 && longOptionStrcmp(&item->option, longName, longNameLen))
	    return 0;
	else
	if (shortName && shortName == item->option.shortName)
	    return 0;
    }

    if (con->aliases == NULL || con->numAliases <= 0) /* XXX can't happen */
	return 0;

    for (i = con->numAliases - 1; i >= 0; i--) {
	item = con->aliases + i;
	if (longName) {
	    if (item->option.longName == NULL)
		continue;
	    if (!longOptionStrcmp(&item->option, longName, longNameLen))
		continue;
	} else if (shortName != item->option.shortName)
	    continue;
	break;
    }
    if (i < 0) return 0;

    if ((con->os - con->optionStack + 1) == POPT_OPTION_DEPTH)
	return POPT_ERROR_OPTSTOODEEP;

    if (longName == NULL && nextArg != NULL && *nextArg != '\0')
	con->os->nextCharArg = nextArg;

    con->os++;
    con->os->next = 0;
    con->os->stuffed = 0;
    con->os->nextArg = NULL;
    con->os->nextCharArg = NULL;
    con->os->currAlias = con->aliases + i;
    {	const char ** av;
	int ac = con->os->currAlias->argc;
	/* Append --foo=bar arg to alias argv array (if present). */ 
	if (longName && nextArg != NULL && *nextArg != '\0') {
	    av = malloc((ac + 1 + 1) * sizeof(*av));
	    if (av != NULL) {	/* XXX won't happen. */
		for (i = 0; i < ac; i++) {
		    av[i] = con->os->currAlias->argv[i];
		}
		av[ac++] = nextArg;
		av[ac] = NULL;
	    } else	/* XXX revert to old popt behavior if malloc fails. */
		av = con->os->currAlias->argv;
	} else
	    av = con->os->currAlias->argv;
	rc = poptDupArgv(ac, av, &con->os->argc, &con->os->argv);
	if (av != NULL && av != con->os->currAlias->argv)
	    free(av);
    }
    con->os->argb = NULL;

    return (rc ? rc : 1);
}